

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall phosg::BitmapImage::write_pixel(BitmapImage *this,size_t x,size_t y,bool v)

{
  out_of_range *this_00;
  long lVar1;
  byte bVar2;
  byte bVar3;
  
  if ((x < this->width) && (y < this->height)) {
    lVar1 = y * this->row_bytes;
    bVar3 = this->data[(x >> 3) + lVar1];
    bVar2 = (byte)x & 7;
    if (v) {
      bVar3 = bVar3 | 0x80U >> bVar2;
    }
    else {
      bVar3 = bVar3 & (byte)(-0x81 >> bVar2);
    }
    this->data[(x >> 3) + lVar1] = bVar3;
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  ::std::out_of_range::out_of_range(this_00,"out of bounds");
  __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
}

Assistant:

void BitmapImage::write_pixel(size_t x, size_t y, bool v) {
  if (x >= this->width || y >= this->height) {
    throw out_of_range("out of bounds");
  }
  if (v) {
    this->data[y * this->row_bytes + (x >> 3)] |= (0x80 >> (x & 7));
  } else {
    this->data[y * this->row_bytes + (x >> 3)] &= ~(0x80 >> (x & 7));
  }
}